

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTryTable(PrintExpressionContents *this,TryTable *curr)

{
  bool bVar1;
  ostream *o;
  undefined1 auVar2 [16];
  uint uVar3;
  Name *pNVar4;
  bool *pbVar5;
  char *pcVar6;
  ulong index;
  string_view str;
  string_view str_00;
  string_view str_01;
  
  str._M_str = "try_table";
  str._M_len = 9;
  printMedium(this->o,str);
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id) {
    std::operator<<(this->o,' ');
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.
                   id;
    printBlockType(this,(Signature)(auVar2 << 0x40));
  }
  for (uVar3 = 0; index = (ulong)uVar3,
      index < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements; uVar3 = uVar3 + 1) {
    std::operator<<(this->o," (");
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    pcVar6 = (pNVar4->super_IString).str._M_str;
    o = this->o;
    pbVar5 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                       (&(curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,index);
    bVar1 = *pbVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "catch_all ";
      if (bVar1 != false) {
        pcVar6 = "catch_all_ref ";
      }
      str_01._M_str = pcVar6;
      str_01._M_len = (ulong)bVar1 * 4 + 10;
      printMedium(o,str_01);
    }
    else {
      pcVar6 = "catch ";
      if (bVar1 != false) {
        pcVar6 = "catch_ref ";
      }
      str_00._M_str = pcVar6;
      str_00._M_len = (ulong)bVar1 * 4 + 6;
      printMedium(o,str_00);
      pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
      Name::print(pNVar4,this->o);
      std::operator<<(this->o,' ');
    }
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    Name::print(pNVar4,this->o);
    std::operator<<(this->o,')');
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    printMedium(o, "try_table");
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
    for (Index i = 0; i < curr->catchTags.size(); i++) {
      o << " (";
      if (curr->catchTags[i]) {
        printMedium(o, curr->catchRefs[i] ? "catch_ref " : "catch ");
        curr->catchTags[i].print(o);
        o << ' ';
      } else {
        printMedium(o, curr->catchRefs[i] ? "catch_all_ref " : "catch_all ");
      }
      curr->catchDests[i].print(o);
      o << ')';
    }
  }